

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlEscapeEntities(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  uint local_54;
  int val;
  uchar *inend;
  uchar *outend;
  uchar *base;
  uchar *outstart;
  int *inlen_local;
  xmlChar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  piVar3 = (int *)(out + *outlen);
  piVar4 = (int *)(in + *inlen);
  inlen_local = (int *)in;
  outlen_local = (int *)out;
  while( true ) {
    iVar2 = (int)inlen_local;
    if (piVar4 <= inlen_local || piVar3 <= outlen_local) break;
    if ((char)*inlen_local == '<') {
      if ((long)piVar3 - (long)outlen_local < 4) break;
      *(undefined1 *)outlen_local = 0x26;
      *(undefined1 *)((long)outlen_local + 1) = 0x6c;
      *(undefined1 *)((long)outlen_local + 2) = 0x74;
      *(undefined1 *)((long)outlen_local + 3) = 0x3b;
      inlen_local = (int *)((long)inlen_local + 1);
      outlen_local = outlen_local + 1;
    }
    else if ((char)*inlen_local == '>') {
      if ((long)piVar3 - (long)outlen_local < 4) break;
      *(undefined1 *)outlen_local = 0x26;
      *(undefined1 *)((long)outlen_local + 1) = 0x67;
      *(undefined1 *)((long)outlen_local + 2) = 0x74;
      *(undefined1 *)((long)outlen_local + 3) = 0x3b;
      inlen_local = (int *)((long)inlen_local + 1);
      outlen_local = outlen_local + 1;
    }
    else if ((char)*inlen_local == '&') {
      if ((long)piVar3 - (long)outlen_local < 5) break;
      *(undefined1 *)outlen_local = 0x26;
      *(undefined1 *)((long)outlen_local + 1) = 0x61;
      *(undefined1 *)((long)outlen_local + 2) = 0x6d;
      *(undefined1 *)((long)outlen_local + 3) = 0x70;
      *(undefined1 *)(outlen_local + 1) = 0x3b;
      inlen_local = (int *)((long)inlen_local + 1);
      outlen_local = (int *)((long)outlen_local + 5);
    }
    else if (((((byte)*inlen_local < 0x20) || (0x7f < (byte)*inlen_local)) &&
             ((char)*inlen_local != '\n')) && ((char)*inlen_local != '\t')) {
      if ((byte)*inlen_local < 0x80) {
        if (((((byte)*inlen_local < 9) || (10 < (byte)*inlen_local)) && ((char)*inlen_local != '\r')
            ) && ((byte)*inlen_local < 0x20)) {
          pp_Var5 = __xmlGenericError();
          p_Var1 = *pp_Var5;
          ppvVar6 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar6,"xmlEscapeEntities : char out of range\n");
          inlen_local._0_4_ = iVar2 + 1;
          goto LAB_0020916a;
        }
        if ((long)piVar3 - (long)outlen_local < 6) break;
        outlen_local = (int *)xmlSerializeHexCharRef((uchar *)outlen_local,(uint)(byte)*inlen_local)
        ;
        inlen_local = (int *)((long)inlen_local + 1);
      }
      else {
        if ((long)piVar3 - (long)outlen_local < 0xb) break;
        if ((byte)*inlen_local < 0xc0) {
          xmlSaveErr(0x578,(xmlNodePtr)0x0,(char *)0x0);
          inlen_local._0_4_ = iVar2 + 1;
          goto LAB_0020916a;
        }
        if ((byte)*inlen_local < 0xe0) {
          if ((long)piVar4 - (long)inlen_local < 2) break;
          local_54 = *(byte *)((long)inlen_local + 1) & 0x3f | ((byte)*inlen_local & 0x1f) << 6;
          inlen_local = (int *)((long)inlen_local + 2);
        }
        else if ((byte)*inlen_local < 0xf0) {
          if ((long)piVar4 - (long)inlen_local < 3) break;
          local_54 = *(byte *)((long)inlen_local + 2) & 0x3f |
                     (*(byte *)((long)inlen_local + 1) & 0x3f | ((byte)*inlen_local & 0xf) << 6) <<
                     6;
          inlen_local = (int *)((long)inlen_local + 3);
        }
        else {
          if (0xf7 < (byte)*inlen_local) {
            xmlSaveErr(0x579,(xmlNodePtr)0x0,(char *)0x0);
            inlen_local._0_4_ = iVar2 + 1;
            goto LAB_0020916a;
          }
          if ((long)piVar4 - (long)inlen_local < 4) break;
          local_54 = *(byte *)((long)inlen_local + 3) & 0x3f |
                     (*(byte *)((long)inlen_local + 2) & 0x3f |
                     (*(byte *)((long)inlen_local + 1) & 0x3f | ((byte)*inlen_local & 7) << 6) << 6)
                     << 6;
          inlen_local = inlen_local + 1;
        }
        if (local_54 < 0x100) {
          if (((local_54 < 9) || (10 < local_54)) && ((local_54 != 0xd && (local_54 < 0x20)))) {
LAB_00209058:
            xmlSaveErr(0x579,(xmlNodePtr)0x0,(char *)0x0);
            inlen_local._0_4_ = (int)inlen_local + 1;
LAB_0020916a:
            *outlen = (int)outlen_local - (int)out;
            *inlen = (int)inlen_local - (int)in;
            return -1;
          }
        }
        else if ((((local_54 < 0x100) || (0xd7ff < local_54)) &&
                 ((local_54 < 0xe000 || (0xfffd < local_54)))) &&
                ((local_54 < 0x10000 || (0x10ffff < local_54)))) goto LAB_00209058;
        outlen_local = (int *)xmlSerializeHexCharRef((uchar *)outlen_local,local_54);
      }
    }
    else {
      *(char *)outlen_local = (char)*inlen_local;
      inlen_local = (int *)((long)inlen_local + 1);
      outlen_local = (int *)((long)outlen_local + 1);
    }
  }
  *outlen = (int)outlen_local - (int)out;
  *inlen = iVar2 - (int)in;
  return 0;
}

Assistant:

static int
xmlEscapeEntities(unsigned char* out, int *outlen,
                 const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    int val;

    inend = in + (*inlen);

    while ((in < inend) && (out < outend)) {
	if (*in == '<') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '>') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '&') {
	    if (outend - out < 5) break;
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (((*in >= 0x20) && (*in < 0x80)) ||
	           (*in == '\n') || (*in == '\t')) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *in++;
	    continue;
	} else if (*in >= 0x80) {
	    /*
	     * We assume we have UTF-8 input.
	     */
	    if (outend - out < 11) break;

	    if (*in < 0xC0) {
		xmlSaveErr(XML_SAVE_NOT_UTF8, NULL, NULL);
		in++;
		goto error;
	    } else if (*in < 0xE0) {
		if (inend - in < 2) break;
		val = (in[0]) & 0x1F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		in += 2;
	    } else if (*in < 0xF0) {
		if (inend - in < 3) break;
		val = (in[0]) & 0x0F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		in += 3;
	    } else if (*in < 0xF8) {
		if (inend - in < 4) break;
		val = (in[0]) & 0x07;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		val <<= 6;
		val |= (in[3]) & 0x3F;
		in += 4;
	    } else {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }
	    if (!IS_CHAR(val)) {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }

	    /*
	     * We could do multiple things here. Just save as a char ref
	     */
	    out = xmlSerializeHexCharRef(out, val);
	} else if (IS_BYTE_CHAR(*in)) {
	    if (outend - out < 6) break;
	    out = xmlSerializeHexCharRef(out, *in++);
	} else {
	    xmlGenericError(xmlGenericErrorContext,
		"xmlEscapeEntities : char out of range\n");
	    in++;
	    goto error;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
error:
    *outlen = out - outstart;
    *inlen = in - base;
    return(-1);
}